

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawLoader.cpp
# Opt level: O0

void __thiscall
Assimp::RAWImporter::InternReadFile
          (RAWImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  allocator<Assimp::RAWImporter::GroupInformation> *this_00;
  char *pcVar1;
  aiFace *paVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  IOStream *__p;
  pointer pIVar6;
  DeadlyImportError *pDVar7;
  char *pcVar8;
  Logger *this_01;
  aiNode *this_02;
  aiMesh **ppaVar9;
  reference pGVar10;
  size_type sVar11;
  reference pMVar12;
  aiMesh *this_03;
  aiVector3D *paVar13;
  reference __src;
  aiColor4D *paVar14;
  reference __src_00;
  ulong *puVar15;
  uint *puVar16;
  aiMaterial *this_04;
  long lVar17;
  aiFace *paVar18;
  ulong uVar19;
  aiFace *local_19e0;
  aiColor4t<float> *local_19a8;
  aiVector3t<float> *local_1978;
  undefined1 local_1824 [8];
  aiString s;
  aiColor4D clr;
  aiMaterial *mat;
  uint m;
  aiFace *f;
  uint n;
  aiFace *fcEnd;
  aiFace *fc;
  aiMesh *mesh_1;
  iterator end2;
  iterator it2;
  uint *pi;
  aiNode *node;
  GroupInformation *outGroup_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
  *__range1_1;
  aiMaterial **ppaStack_1390;
  uint meshIdx;
  aiMaterial **mats;
  aiNode **cc;
  string local_1378;
  reference local_1358;
  GroupInformation *outGroup;
  iterator __end1;
  iterator __begin1;
  vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
  *__range1;
  aiVector3t<float> local_1328;
  aiVector3t<float> local_131c;
  aiVector3t<float> local_1310;
  aiVector3t<float> local_1304;
  aiVector3t<float> local_12f8;
  undefined1 local_12ec [8];
  aiColor4D v;
  MeshInformation local_12b8;
  reference local_1268;
  MeshInformation *mesh;
  iterator __end3;
  iterator __begin3;
  vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
  *__range3;
  char *pcStack_1240;
  uint length_1;
  char *sz2_1;
  MeshInformation *output;
  float local_1228;
  uint num;
  float data [12];
  __normal_iterator<Assimp::RAWImporter::GroupInformation_*,_std::vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>_>
  local_11f0;
  GroupInformation *local_11e8;
  allocator local_11d9;
  string local_11d8;
  GroupInformation local_11b8;
  __normal_iterator<Assimp::RAWImporter::GroupInformation_*,_std::vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>_>
  local_1180;
  iterator end;
  iterator it;
  char *pcStack_1168;
  uint length;
  char *sz2;
  char *sz;
  char line [4096];
  __normal_iterator<Assimp::RAWImporter::GroupInformation_*,_std::vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>_>
  local_150;
  iterator curGroup;
  string local_140;
  GroupInformation local_120;
  undefined1 local_e8 [8];
  vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
  outGroups;
  char *buffer;
  vector<char,_std::allocator<char>_> mBuffer2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  RAWImporter *this_local;
  
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pIVar6 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar6 == (pointer)0x0) {
    mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 1;
    pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open RAW file ",pFile);
    std::operator+(&local_88,&local_a8,".");
    DeadlyImportError::DeadlyImportError(pDVar7,&local_88);
    mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0;
    __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&buffer);
  pIVar6 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  BaseImporter::TextFileToBuffer(pIVar6,(vector<char,_std::allocator<char>_> *)&buffer,FORBID_EMPTY)
  ;
  outGroups.
  super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)&buffer,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"<default>",(allocator<char> *)((long)&curGroup._M_current + 7));
  GroupInformation::GroupInformation(&local_120,&local_140);
  this_00 = (allocator<Assimp::RAWImporter::GroupInformation> *)((long)&curGroup._M_current + 6);
  std::allocator<Assimp::RAWImporter::GroupInformation>::allocator(this_00);
  std::
  vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
  ::vector((vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
            *)local_e8,1,&local_120,this_00);
  std::allocator<Assimp::RAWImporter::GroupInformation>::~allocator
            ((allocator<Assimp::RAWImporter::GroupInformation> *)((long)&curGroup._M_current + 6));
  GroupInformation::~GroupInformation(&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&curGroup._M_current + 7));
  local_150._M_current =
       (GroupInformation *)
       std::
       vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
       ::begin((vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                *)local_e8);
  do {
    while( true ) {
      do {
        bVar3 = GetNextLine<char>((char **)&outGroups.
                                            super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (char *)&sz);
        if (!bVar3) {
          this_02 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(this_02);
          pScene->mRootNode = this_02;
          aiString::Set(&pScene->mRootNode->mName,"<RawRoot>");
          __end1 = std::
                   vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                   ::begin((vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                            *)local_e8);
          outGroup = (GroupInformation *)
                     std::
                     vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                     ::end((vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                            *)local_e8);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end1,(__normal_iterator<Assimp::RAWImporter::GroupInformation_*,_std::vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>_>
                                             *)&outGroup), bVar3) {
            local_1358 = __gnu_cxx::
                         __normal_iterator<Assimp::RAWImporter::GroupInformation_*,_std::vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>_>
                         ::operator*(&__end1);
            bVar3 = std::
                    vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                    ::empty(&local_1358->meshes);
            if (!bVar3) {
              pScene->mRootNode->mNumChildren = pScene->mRootNode->mNumChildren + 1;
              sVar11 = std::
                       vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                       ::size(&local_1358->meshes);
              pScene->mNumMeshes = (int)sVar11 + pScene->mNumMeshes;
            }
            __gnu_cxx::
            __normal_iterator<Assimp::RAWImporter::GroupInformation_*,_std::vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>_>
            ::operator++(&__end1);
          }
          if (pScene->mNumMeshes == 0) {
            cc._6_1_ = 1;
            pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1378,
                       "RAW: No meshes loaded. The file seems to be corrupt or empty.",
                       (allocator<char> *)((long)&cc + 7));
            DeadlyImportError::DeadlyImportError(pDVar7,&local_1378);
            cc._6_1_ = 0;
            __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          ppaVar9 = (aiMesh **)operator_new__((ulong)pScene->mNumMeshes << 3);
          pScene->mMeshes = ppaVar9;
          if (pScene->mRootNode->mNumChildren == 1) {
            mats = (aiMaterial **)&pScene->mRootNode;
            pScene->mRootNode->mNumChildren = 0;
          }
          else {
            mats = (aiMaterial **)operator_new__((ulong)pScene->mRootNode->mNumChildren << 3);
            memset(mats,0,(ulong)pScene->mRootNode->mNumChildren << 3);
            pScene->mRootNode->mChildren = (aiNode **)mats;
          }
          pScene->mNumMaterials = pScene->mNumMeshes;
          ppaStack_1390 = (aiMaterial **)operator_new__((ulong)pScene->mNumMaterials << 3);
          pScene->mMaterials = ppaStack_1390;
          __range1_1._4_4_ = 0;
          __end1_1 = std::
                     vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                     ::begin((vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                              *)local_e8);
          outGroup_1 = (GroupInformation *)
                       std::
                       vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                       ::end((vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                              *)local_e8);
          do {
            bVar3 = __gnu_cxx::operator!=
                              (&__end1_1,
                               (__normal_iterator<Assimp::RAWImporter::GroupInformation_*,_std::vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>_>
                                *)&outGroup_1);
            if (!bVar3) {
              std::
              vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
              ::~vector((vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                         *)local_e8);
              std::vector<char,_std::allocator<char>_>::~vector
                        ((vector<char,_std::allocator<char>_> *)&buffer);
              std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                        (&local_30);
              return;
            }
            pGVar10 = __gnu_cxx::
                      __normal_iterator<Assimp::RAWImporter::GroupInformation_*,_std::vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>_>
                      ::operator*(&__end1_1);
            bVar3 = std::
                    vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                    ::empty(&pGVar10->meshes);
            if (!bVar3) {
              if (pScene->mRootNode->mNumChildren == 0) {
                pi = (uint *)*mats;
              }
              else {
                pi = (uint *)operator_new(0x478);
                aiNode::aiNode((aiNode *)pi);
                *mats = (aiMaterial *)pi;
                ((aiNode *)pi)->mParent = pScene->mRootNode;
              }
              aiString::Set((aiString *)pi,&pGVar10->name);
              sVar11 = std::
                       vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                       ::size(&pGVar10->meshes);
              pi[0x118] = (uint)sVar11;
              it2._M_current = (MeshInformation *)operator_new__((ulong)pi[0x118] << 2);
              *(MeshInformation **)(pi + 0x11a) = it2._M_current;
              end2 = std::
                     vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                     ::begin(&pGVar10->meshes);
              mesh_1 = (aiMesh *)
                       std::
                       vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                       ::end(&pGVar10->meshes);
              while (bVar3 = __gnu_cxx::operator!=
                                       (&end2,(__normal_iterator<Assimp::RAWImporter::MeshInformation_*,_std::vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>_>
                                               *)&mesh_1), bVar3) {
                pMVar12 = __gnu_cxx::
                          __normal_iterator<Assimp::RAWImporter::MeshInformation_*,_std::vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>_>
                          ::operator*(&end2);
                bVar3 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                                  (&pMVar12->vertices);
                if (((bVar3 ^ 0xffU) & 1) == 0) {
                  __assert_fail("!(*it2).vertices.empty()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Raw/RawLoader.cpp"
                                ,0x114,
                                "virtual void Assimp::RAWImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                               );
                }
                *(uint *)&(it2._M_current)->name = __range1_1._4_4_;
                this_03 = (aiMesh *)operator_new(0x520);
                aiMesh::aiMesh(this_03);
                pScene->mMeshes[__range1_1._4_4_] = this_03;
                this_03->mMaterialIndex = __range1_1._4_4_;
                this_03->mPrimitiveTypes = 4;
                pMVar12 = __gnu_cxx::
                          __normal_iterator<Assimp::RAWImporter::MeshInformation_*,_std::vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>_>
                          ::operator*(&end2);
                sVar11 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                   (&pMVar12->vertices);
                this_03->mNumVertices = (uint)sVar11;
                uVar19 = (ulong)this_03->mNumVertices;
                paVar13 = (aiVector3D *)operator_new__(uVar19 * 0xc);
                if (uVar19 != 0) {
                  local_1978 = paVar13;
                  do {
                    aiVector3t<float>::aiVector3t(local_1978);
                    local_1978 = local_1978 + 1;
                  } while (local_1978 != paVar13 + uVar19);
                }
                this_03->mVertices = paVar13;
                paVar13 = this_03->mVertices;
                pMVar12 = __gnu_cxx::
                          __normal_iterator<Assimp::RAWImporter::MeshInformation_*,_std::vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>_>
                          ::operator*(&end2);
                __src = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                        operator[](&pMVar12->vertices,0);
                memcpy(paVar13,__src,(ulong)this_03->mNumVertices * 0xc);
                pMVar12 = __gnu_cxx::
                          __normal_iterator<Assimp::RAWImporter::MeshInformation_*,_std::vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>_>
                          ::operator*(&end2);
                sVar11 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size
                                   (&pMVar12->colors);
                if (sVar11 != 0) {
                  pMVar12 = __gnu_cxx::
                            __normal_iterator<Assimp::RAWImporter::MeshInformation_*,_std::vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>_>
                            ::operator*(&end2);
                  sVar11 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size
                                     (&pMVar12->colors);
                  if (sVar11 != this_03->mNumVertices) {
                    __assert_fail("(*it2).colors.size() == mesh->mNumVertices",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Raw/RawLoader.cpp"
                                  ,0x124,
                                  "virtual void Assimp::RAWImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                                 );
                  }
                  uVar19 = (ulong)this_03->mNumVertices;
                  paVar14 = (aiColor4D *)operator_new__(uVar19 << 4);
                  if (uVar19 != 0) {
                    local_19a8 = paVar14;
                    do {
                      aiColor4t<float>::aiColor4t(local_19a8);
                      local_19a8 = local_19a8 + 1;
                    } while (local_19a8 != paVar14 + uVar19);
                  }
                  this_03->mColors[0] = paVar14;
                  paVar14 = this_03->mColors[0];
                  pMVar12 = __gnu_cxx::
                            __normal_iterator<Assimp::RAWImporter::MeshInformation_*,_std::vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>_>
                            ::operator*(&end2);
                  __src_00 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::
                             operator[](&pMVar12->colors,0);
                  memcpy(paVar14,__src_00,(ulong)this_03->mNumVertices << 4);
                }
                if (this_03->mNumVertices % 3 != 0) {
                  __assert_fail("0 == mesh->mNumVertices % 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Raw/RawLoader.cpp"
                                ,299,
                                "virtual void Assimp::RAWImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                               );
                }
                uVar19 = (ulong)this_03->mNumVertices / 3;
                this_03->mNumFaces = this_03->mNumVertices / 3;
                puVar15 = (ulong *)operator_new__(uVar19 << 4 | 8);
                *puVar15 = uVar19;
                paVar18 = (aiFace *)(puVar15 + 1);
                if (uVar19 != 0) {
                  local_19e0 = paVar18;
                  do {
                    aiFace::aiFace(local_19e0);
                    local_19e0 = local_19e0 + 1;
                  } while (local_19e0 != paVar18 + uVar19);
                }
                this_03->mFaces = paVar18;
                uVar4 = this_03->mNumFaces;
                f._4_4_ = 0;
                paVar2 = paVar18;
                while (fcEnd = paVar2, fcEnd != paVar18 + uVar4) {
                  fcEnd->mNumIndices = 3;
                  puVar16 = (uint *)operator_new__(0xc);
                  fcEnd->mIndices = puVar16;
                  for (mat._4_4_ = 0; paVar2 = fcEnd + 1, mat._4_4_ < 3; mat._4_4_ = mat._4_4_ + 1)
                  {
                    fcEnd->mIndices[mat._4_4_] = f._4_4_;
                    f._4_4_ = f._4_4_ + 1;
                  }
                }
                this_04 = (aiMaterial *)operator_new(0x10);
                aiMaterial::aiMaterial(this_04);
                aiColor4t<float>::aiColor4t((aiColor4t<float> *)(s.data + 0x3f8),1.0,1.0,1.0,1.0);
                pMVar12 = __gnu_cxx::
                          __normal_iterator<Assimp::RAWImporter::MeshInformation_*,_std::vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>_>
                          ::operator*(&end2);
                bVar3 = std::operator==("%default%",&pMVar12->name);
                if (bVar3) {
                  s.data[0x3fc] = -0x66;
                  s.data[0x3fd] = -0x67;
                  s.data[0x3fe] = '\x19';
                  s.data[0x3ff] = '?';
                  s.data[0x3f8] = -0x66;
                  s.data[0x3f9] = -0x67;
                  s.data[0x3fa] = '\x19';
                  s.data[0x3fb] = '?';
                }
                else {
                  __gnu_cxx::
                  __normal_iterator<Assimp::RAWImporter::MeshInformation_*,_std::vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>_>
                  ::operator*(&end2);
                  lVar17 = std::__cxx11::string::length();
                  if (lVar17 != 0) {
                    aiString::aiString((aiString *)local_1824);
                    pMVar12 = __gnu_cxx::
                              __normal_iterator<Assimp::RAWImporter::MeshInformation_*,_std::vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>_>
                              ::operator*(&end2);
                    aiString::Set((aiString *)local_1824,&pMVar12->name);
                    aiMaterial::AddProperty(this_04,(aiString *)local_1824,"$tex.file",1,0);
                  }
                }
                aiMaterial::AddProperty<aiColor4t<float>>
                          (this_04,(aiColor4D *)(s.data + 0x3f8),1,"$clr.diffuse",0,0);
                *ppaStack_1390 = this_04;
                __gnu_cxx::
                __normal_iterator<Assimp::RAWImporter::MeshInformation_*,_std::vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>_>
                ::operator++(&end2);
                it2._M_current = (MeshInformation *)&((it2._M_current)->name).field_0x4;
                __range1_1._4_4_ = __range1_1._4_4_ + 1;
                ppaStack_1390 = ppaStack_1390 + 1;
              }
            }
            __gnu_cxx::
            __normal_iterator<Assimp::RAWImporter::GroupInformation_*,_std::vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>_>
            ::operator++(&__end1_1);
          } while( true );
        }
        sz2 = (char *)&sz;
        SkipSpaces<char>(&sz2);
        bVar3 = IsLineEnd<char>(*sz2);
      } while (bVar3);
      bVar3 = IsNumeric<char>(*sz2);
      if (!bVar3) break;
      output._4_4_ = 0;
      while (((output._4_4_ < 0xc && (bVar3 = SkipSpaces<char>(&sz2), bVar3)) &&
             (bVar3 = IsNumeric<char>(*sz2), bVar3))) {
        sz2 = fast_atoreal_move<float>(sz2,&local_1228 + output._4_4_,true);
        output._4_4_ = output._4_4_ + 1;
      }
      if ((output._4_4_ == 0xc) || (output._4_4_ == 9)) {
        sz2_1 = (char *)0x0;
        pcStack_1240 = sz2;
        bVar3 = IsLineEnd<char>(*sz2);
        if (bVar3) {
          if (output._4_4_ == 9) {
            sz2 = "%default%";
            __range3._4_4_ = 9;
          }
          else {
            sz2 = "";
            __range3._4_4_ = 0;
          }
        }
        else {
          while (bVar3 = IsSpaceOrNewLine<char>(*pcStack_1240), ((bVar3 ^ 0xffU) & 1) != 0) {
            pcStack_1240 = pcStack_1240 + 1;
          }
          __range3._4_4_ = (int)pcStack_1240 - (int)sz2;
        }
        pGVar10 = __gnu_cxx::
                  __normal_iterator<Assimp::RAWImporter::GroupInformation_*,_std::vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>_>
                  ::operator*(&local_150);
        __end3 = std::
                 vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                 ::begin(&pGVar10->meshes);
        mesh = (MeshInformation *)
               std::
               vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
               ::end(&pGVar10->meshes);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<Assimp::RAWImporter::MeshInformation_*,_std::vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>_>
                                           *)&mesh), bVar3) {
          local_1268 = __gnu_cxx::
                       __normal_iterator<Assimp::RAWImporter::MeshInformation_*,_std::vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>_>
                       ::operator*(&__end3);
          uVar19 = std::__cxx11::string::length();
          pcVar1 = sz2;
          if (__range3._4_4_ == uVar19) {
            if (__range3._4_4_ != 0) {
              pcVar8 = (char *)std::__cxx11::string::c_str();
              iVar5 = strcmp(pcVar1,pcVar8);
              if (iVar5 != 0) goto LAB_00a53b2b;
            }
            sz2_1 = (char *)local_1268;
            break;
          }
LAB_00a53b2b:
          __gnu_cxx::
          __normal_iterator<Assimp::RAWImporter::MeshInformation_*,_std::vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>_>
          ::operator++(&__end3);
        }
        if (sz2_1 == (char *)0x0) {
          pGVar10 = __gnu_cxx::
                    __normal_iterator<Assimp::RAWImporter::GroupInformation_*,_std::vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>_>
                    ::operator*(&local_150);
          pcVar1 = sz2;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&v.a,pcVar1,(ulong)__range3._4_4_,(allocator *)((long)&v.b + 3));
          MeshInformation::MeshInformation(&local_12b8,(string *)&v.a);
          std::
          vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
          ::push_back(&pGVar10->meshes,&local_12b8);
          MeshInformation::~MeshInformation(&local_12b8);
          std::__cxx11::string::~string((string *)&v.a);
          std::allocator<char>::~allocator((allocator<char> *)((long)&v.b + 3));
          pGVar10 = __gnu_cxx::
                    __normal_iterator<Assimp::RAWImporter::GroupInformation_*,_std::vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>_>
                    ::operator*(&local_150);
          sz2_1 = (char *)std::
                          vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                          ::back(&pGVar10->meshes);
        }
        if (output._4_4_ == 0xc) {
          aiColor4t<float>::aiColor4t
                    ((aiColor4t<float> *)local_12ec,local_1228,(float)num,data[0],1.0);
          std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                    ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(sz2_1 + 0x38),
                     (value_type *)local_12ec);
          std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                    ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(sz2_1 + 0x38),
                     (value_type *)local_12ec);
          std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                    ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)(sz2_1 + 0x38),
                     (value_type *)local_12ec);
          aiVector3t<float>::aiVector3t(&local_12f8,data[1],data[2],data[3]);
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     (sz2_1 + 0x20),&local_12f8);
          aiVector3t<float>::aiVector3t(&local_1304,data[4],data[5],data[6]);
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     (sz2_1 + 0x20),&local_1304);
          aiVector3t<float>::aiVector3t(&local_1310,data[7],data[8],data[9]);
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     (sz2_1 + 0x20),&local_1310);
        }
        else {
          aiVector3t<float>::aiVector3t(&local_131c,local_1228,(float)num,data[0]);
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     (sz2_1 + 0x20),&local_131c);
          aiVector3t<float>::aiVector3t(&local_1328,data[1],data[2],data[3]);
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     (sz2_1 + 0x20),&local_1328);
          aiVector3t<float>::aiVector3t
                    ((aiVector3t<float> *)((long)&__range1 + 4),data[4],data[5],data[6]);
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     (sz2_1 + 0x20),(value_type *)((long)&__range1 + 4));
        }
      }
      else {
        this_01 = DefaultLogger::get();
        Logger::error(this_01,"A line may have either 9 or 12 floats and an optional texture");
      }
    }
    pcStack_1168 = sz2;
    while (bVar3 = IsSpaceOrNewLine<char>(*pcStack_1168), ((bVar3 ^ 0xffU) & 1) != 0) {
      pcStack_1168 = pcStack_1168 + 1;
    }
    uVar4 = (int)pcStack_1168 - (int)sz2;
    end = std::
          vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
          ::begin((vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                   *)local_e8);
    local_1180._M_current =
         (GroupInformation *)
         std::
         vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
         ::end((vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                *)local_e8);
    while (bVar3 = __gnu_cxx::operator!=(&end,&local_1180), bVar3) {
      __gnu_cxx::
      __normal_iterator<Assimp::RAWImporter::GroupInformation_*,_std::vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>_>
      ::operator*(&end);
      uVar19 = std::__cxx11::string::length();
      pcVar1 = sz2;
      if (uVar4 == uVar19) {
        __gnu_cxx::
        __normal_iterator<Assimp::RAWImporter::GroupInformation_*,_std::vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>_>
        ::operator*(&end);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        iVar5 = strcmp(pcVar1,pcVar8);
        if (iVar5 == 0) {
          local_150._M_current = end._M_current;
          pcStack_1168 = (char *)0x0;
          break;
        }
      }
      __gnu_cxx::
      __normal_iterator<Assimp::RAWImporter::GroupInformation_*,_std::vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>_>
      ::operator++(&end);
    }
    pcVar1 = sz2;
    if (pcStack_1168 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_11d8,pcVar1,(ulong)uVar4,&local_11d9);
      GroupInformation::GroupInformation(&local_11b8,&local_11d8);
      std::
      vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
      ::push_back((vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                   *)local_e8,&local_11b8);
      GroupInformation::~GroupInformation(&local_11b8);
      std::__cxx11::string::~string((string *)&local_11d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_11d9);
      local_11f0._M_current =
           (GroupInformation *)
           std::
           vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
           ::end((vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                  *)local_e8);
      local_11e8 = (GroupInformation *)
                   __gnu_cxx::
                   __normal_iterator<Assimp::RAWImporter::GroupInformation_*,_std::vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>_>
                   ::operator-(&local_11f0,1);
      local_150 = (__normal_iterator<Assimp::RAWImporter::GroupInformation_*,_std::vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>_>
                   )local_11e8;
    }
  } while( true );
}

Assistant:

void RAWImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL) {
        throw DeadlyImportError( "Failed to open RAW file " + pFile + ".");
    }

    // allocate storage and copy the contents of the file to a memory buffer
    // (terminate it with zero)
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    // list of groups loaded from the file
    std::vector< GroupInformation > outGroups(1,GroupInformation("<default>"));
    std::vector< GroupInformation >::iterator curGroup = outGroups.begin();

    // now read all lines
    char line[4096];
    while (GetNextLine(buffer,line))
    {
        // if the line starts with a non-numeric identifier, it marks
        // the beginning of a new group
        const char* sz = line;SkipSpaces(&sz);
        if (IsLineEnd(*sz))continue;
        if (!IsNumeric(*sz))
        {
            const char* sz2 = sz;
            while (!IsSpaceOrNewLine(*sz2))++sz2;
            const unsigned int length = (unsigned int)(sz2-sz);

            // find an existing group with this name
            for (std::vector< GroupInformation >::iterator it = outGroups.begin(), end = outGroups.end();
                it != end;++it)
            {
                if (length == (*it).name.length() && !::strcmp(sz,(*it).name.c_str()))
                {
                    curGroup = it;sz2 = NULL;
                    break;
                }
            }
            if (sz2)
            {
                outGroups.push_back(GroupInformation(std::string(sz,length)));
                curGroup = outGroups.end()-1;
            }
        }
        else
        {
            // there can be maximally 12 floats plus an extra texture file name
            float data[12];
            unsigned int num;
            for (num = 0; num < 12;++num)
            {
                if(!SkipSpaces(&sz) || !IsNumeric(*sz))break;
                sz = fast_atoreal_move<float>(sz,data[num]);
            }
            if (num != 12 && num != 9)
            {
                ASSIMP_LOG_ERROR("A line may have either 9 or 12 floats and an optional texture");
                continue;
            }

            MeshInformation* output = NULL;

            const char* sz2 = sz;
            unsigned int length;
            if (!IsLineEnd(*sz))
            {
                while (!IsSpaceOrNewLine(*sz2))++sz2;
                length = (unsigned int)(sz2-sz);
            }
            else if (9 == num)
            {
                sz = "%default%";
                length = 9;
            }
            else
            {
                sz = "";
                length = 0;
            }

            // search in the list of meshes whether we have one with this texture
            for (auto &mesh : (*curGroup).meshes)
            {
                if (length == mesh.name.length() && (length ? !::strcmp(sz, mesh.name.c_str()) : true))
                {
                    output = &mesh;
                    break;
                }
            }
            // if we don't have the mesh, create it
            if (!output)
            {
                (*curGroup).meshes.push_back(MeshInformation(std::string(sz,length)));
                output = &((*curGroup).meshes.back());
            }
            if (12 == num)
            {
                aiColor4D v(data[0],data[1],data[2],1.0f);
                output->colors.push_back(v);
                output->colors.push_back(v);
                output->colors.push_back(v);

                output->vertices.push_back(aiVector3D(data[3],data[4],data[5]));
                output->vertices.push_back(aiVector3D(data[6],data[7],data[8]));
                output->vertices.push_back(aiVector3D(data[9],data[10],data[11]));
            }
            else
            {
                output->vertices.push_back(aiVector3D(data[0],data[1],data[2]));
                output->vertices.push_back(aiVector3D(data[3],data[4],data[5]));
                output->vertices.push_back(aiVector3D(data[6],data[7],data[8]));
            }
        }
    }

    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("<RawRoot>");

    // count the number of valid groups
    // (meshes can't be empty)
    for (auto & outGroup : outGroups)
    {
        if (!outGroup.meshes.empty())
        {
            ++pScene->mRootNode->mNumChildren;
            pScene->mNumMeshes += (unsigned int) outGroup.meshes.size();
        }
    }

    if (!pScene->mNumMeshes)
    {
        throw DeadlyImportError("RAW: No meshes loaded. The file seems to be corrupt or empty.");
    }

    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    aiNode** cc;
    if (1 == pScene->mRootNode->mNumChildren)
    {
        cc = &pScene->mRootNode;
        pScene->mRootNode->mNumChildren = 0;
    } else {
        cc = new aiNode*[pScene->mRootNode->mNumChildren];
        memset(cc, 0, sizeof(aiNode*) * pScene->mRootNode->mNumChildren);
        pScene->mRootNode->mChildren = cc;
    }

    pScene->mNumMaterials = pScene->mNumMeshes;
    aiMaterial** mats = pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];

    unsigned int meshIdx = 0;
    for (auto & outGroup : outGroups)
    {
        if (outGroup.meshes.empty())continue;

        aiNode* node;
        if (pScene->mRootNode->mNumChildren)
        {
            node = *cc = new aiNode();
            node->mParent = pScene->mRootNode;
        }
        else node = *cc;
        node->mName.Set(outGroup.name);

        // add all meshes
        node->mNumMeshes = (unsigned int) outGroup.meshes.size();
        unsigned int* pi = node->mMeshes = new unsigned int[ node->mNumMeshes ];
        for (std::vector< MeshInformation >::iterator it2 = outGroup.meshes.begin(),
            end2 = outGroup.meshes.end(); it2 != end2; ++it2)
        {
            ai_assert(!(*it2).vertices.empty());

            // allocate the mesh
            *pi++ = meshIdx;
            aiMesh* mesh = pScene->mMeshes[meshIdx] = new aiMesh();
            mesh->mMaterialIndex = meshIdx++;

            mesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

            // allocate storage for the vertex components and copy them
            mesh->mNumVertices = (unsigned int)(*it2).vertices.size();
            mesh->mVertices = new aiVector3D[ mesh->mNumVertices ];
            ::memcpy(mesh->mVertices,&(*it2).vertices[0],sizeof(aiVector3D)*mesh->mNumVertices);

            if ((*it2).colors.size())
            {
                ai_assert((*it2).colors.size() == mesh->mNumVertices);

                mesh->mColors[0] = new aiColor4D[ mesh->mNumVertices ];
                ::memcpy(mesh->mColors[0],&(*it2).colors[0],sizeof(aiColor4D)*mesh->mNumVertices);
            }

            // generate triangles
            ai_assert(0 == mesh->mNumVertices % 3);
            aiFace* fc = mesh->mFaces = new aiFace[ mesh->mNumFaces = mesh->mNumVertices/3 ];
            aiFace* const fcEnd = fc + mesh->mNumFaces;
            unsigned int n = 0;
            while (fc != fcEnd)
            {
                aiFace& f = *fc++;
                f.mIndices = new unsigned int[f.mNumIndices = 3];
                for (unsigned int m = 0; m < 3;++m)
                    f.mIndices[m] = n++;
            }

            // generate a material for the mesh
            aiMaterial* mat = new aiMaterial();

            aiColor4D clr(1.0f,1.0f,1.0f,1.0f);
            if ("%default%" == (*it2).name) // a gray default material
            {
                clr.r = clr.g = clr.b = 0.6f;
            }
            else if ((*it2).name.length() > 0) // a texture
            {
                aiString s;
                s.Set((*it2).name);
                mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(0));
            }
            mat->AddProperty<aiColor4D>(&clr,1,AI_MATKEY_COLOR_DIFFUSE);
            *mats++ = mat;
        }
    }
}